

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O0

void __thiscall
cmPropertyDefinitionMap::DefineProperty
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope,string *ShortDescription,
          string *FullDescription,bool chain,string *initializeFromVariable)

{
  bool bVar1;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  local_68;
  _Self local_40;
  iterator it;
  bool chain_local;
  string *FullDescription_local;
  string *ShortDescription_local;
  string *psStack_18;
  ScopeType scope_local;
  string *name_local;
  cmPropertyDefinitionMap *this_local;
  
  it._M_node._7_1_ = chain;
  ShortDescription_local._4_4_ = scope;
  psStack_18 = name;
  name_local = (string *)this;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  ::pair<cmProperty::ScopeType_&,_true>
            (&local_68,name,(ScopeType *)((long)&ShortDescription_local + 4));
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
       ::find(&this->Map_,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  ::~pair(&local_68);
  local_90.field_2._M_allocated_capacity =
       (size_type)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
       ::end(&this->Map_);
  bVar1 = std::operator==(&local_40,(_Self *)&local_90.field_2._M_allocated_capacity);
  if (bVar1) {
    std::forward_as_tuple<std::__cxx11::string_const&,cmProperty::ScopeType&>
              (&local_90,(ScopeType *)psStack_18);
    std::
    forward_as_tuple<std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&>
              (&local_b0,ShortDescription,FullDescription,(bool *)((long)&it._M_node + 7),
               initializeFromVariable);
    std::
    map<std::pair<std::__cxx11::string,cmProperty::ScopeType>,cmPropertyDefinition,std::less<std::pair<std::__cxx11::string,cmProperty::ScopeType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>>
    ::
    emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&,cmProperty::ScopeType&>,std::tuple<std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&>>
              ((map<std::pair<std::__cxx11::string,cmProperty::ScopeType>,cmPropertyDefinition,std::less<std::pair<std::__cxx11::string,cmProperty::ScopeType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>>
                *)this,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmProperty::ScopeType_&>
                *)&local_90,&local_b0);
  }
  return;
}

Assistant:

void cmPropertyDefinitionMap::DefineProperty(
  const std::string& name, cmProperty::ScopeType scope,
  const std::string& ShortDescription, const std::string& FullDescription,
  bool chain, const std::string& initializeFromVariable)
{
  auto it = this->Map_.find(KeyType(name, scope));
  if (it == this->Map_.end()) {
    // try_emplace() since C++17
    this->Map_.emplace(std::piecewise_construct,
                       std::forward_as_tuple(name, scope),
                       std::forward_as_tuple(ShortDescription, FullDescription,
                                             chain, initializeFromVariable));
  }
}